

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O0

void __thiscall NDeviceChannel::~NDeviceChannel(NDeviceChannel *this)

{
  NDeviceChannel *in_RDI;
  
  ~NDeviceChannel(in_RDI);
  operator_delete(in_RDI,0x40);
  return;
}

Assistant:

NDeviceChannel::~NDeviceChannel() {

}